

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O0

void __thiscall
SuiteDataDictionaryTests::TestaddValueName::~TestaddValueName(TestaddValueName *this)

{
  TestaddValueName *this_local;
  
  ~TestaddValueName(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(addValueName)
{
  DataDictionary object;
  object.setVersion( "FIX.4.2" );

  object.addValueName( 12, "0", "VALUE_12_0" );
  object.addValueName( 12, "B", "VALUE_12_B" );
  object.addValueName( 23, "BOO", "VALUE_23_BOO" );

  std::string name;
  std::string value;

  CHECK( object.getValueName( 12, "0", name ) );
  CHECK_EQUAL( "VALUE_12_0", name );
  CHECK( object.getNameValue( 12, "VALUE_12_0", value ) );
  CHECK_EQUAL( "0", value );

  CHECK( object.getValueName( 12, "B", name ) );
  CHECK_EQUAL( "VALUE_12_B", name );
  CHECK( object.getNameValue( 12, "VALUE_12_B", value ) );
  CHECK_EQUAL( "B", value );

  CHECK( object.getValueName( 23, "BOO", name ) );
  CHECK_EQUAL( "VALUE_23_BOO", name );
  CHECK( object.getNameValue( 23, "VALUE_23_BOO", value ) );
  CHECK_EQUAL( "BOO", value );
}